

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O1

void processCompileOptionsInternal
               (cmTarget *tgt,
               vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
               *entries,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *options,
               hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
               *uniqueOptions,cmGeneratorExpressionDAGChecker *dagChecker,string *config,
               bool debugOptions,char *logName,string *language)

{
  cmCompiledGeneratorExpression *__x;
  char *pcVar1;
  long *plVar2;
  cmake *this;
  undefined8 *puVar3;
  pointer pcVar4;
  ulong *puVar5;
  long *plVar6;
  size_type *psVar7;
  pointer ppTVar8;
  ulong uVar9;
  undefined8 uVar10;
  pointer __obj;
  pair<cmsys::_Hashtable_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
  __p;
  string usedOptions;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  entryOptions;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  long *local_188;
  undefined8 local_180;
  long local_178;
  undefined8 uStack_170;
  cmTarget *local_168;
  ulong *local_160;
  long local_158;
  ulong local_150;
  undefined4 uStack_148;
  undefined4 uStack_144;
  undefined1 local_140 [24];
  cmState *pcStack_128;
  cmLinkedTree<cmState::SnapshotDataType> *pcStack_120;
  PositionType local_118;
  _Alloc_hider local_110;
  long local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  undefined1 *local_f0;
  long local_e8;
  undefined1 local_e0;
  undefined7 uStack_df;
  cmMakefile *local_d0;
  long *local_c8;
  long local_c0;
  long local_b8;
  long lStack_b0;
  long *local_a8;
  long local_a0;
  long local_98;
  long lStack_90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  long *local_68 [2];
  long local_58 [2];
  pointer local_48;
  cmGeneratorExpressionDAGChecker *local_40;
  string *local_38;
  
  ppTVar8 = (entries->
            super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_48 = (entries->
             super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  if (ppTVar8 != local_48) {
    local_d0 = tgt->Makefile;
    local_168 = tgt;
    local_40 = dagChecker;
    local_38 = config;
    do {
      local_88.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (value_type *)0x0;
      local_88.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (value_type *)0x0;
      local_88.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pcVar1 = cmCompiledGeneratorExpression::Evaluate
                         (((*ppTVar8)->ge).x_,local_d0,local_38,false,local_168,local_40,language);
      std::__cxx11::string::string((string *)local_140,pcVar1,(allocator *)&local_f0);
      cmSystemTools::ExpandListArgument((string *)local_140,&local_88,false);
      if ((pointer)local_140._0_8_ != (pointer)(local_140 + 0x10)) {
        operator_delete((void *)local_140._0_8_,
                        (ulong)((long)&(((string *)local_140._16_8_)->_M_dataplus)._M_p + 1));
      }
      local_f0 = &local_e0;
      local_e8 = 0;
      local_e0 = 0;
      for (__obj = local_88.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          __obj != local_88.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish; __obj = __obj + 1) {
        cmsys::
        hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
        ::resize(&uniqueOptions->_M_ht,(uniqueOptions->_M_ht)._M_num_elements + 1);
        cmsys::
        hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
        ::insert_unique_noresize
                  ((pair<cmsys::_Hashtable_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
                    *)local_140,&uniqueOptions->_M_ht,__obj);
        if (local_140[0x10] == '\x01') {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(options,__obj);
          if (debugOptions) {
            std::operator+(&local_1a8," * ",__obj);
            plVar2 = (long *)std::__cxx11::string::append((char *)&local_1a8);
            local_140._0_8_ = local_140 + 0x10;
            pcVar4 = (pointer)(plVar2 + 2);
            if ((pointer)*plVar2 == pcVar4) {
              local_140._16_8_ = (pcVar4->Name)._M_dataplus._M_p;
              pcStack_128 = (cmState *)plVar2[3];
            }
            else {
              local_140._16_8_ = (pcVar4->Name)._M_dataplus._M_p;
              local_140._0_8_ = (pointer)*plVar2;
            }
            local_140._8_8_ = plVar2[1];
            *plVar2 = (long)pcVar4;
            plVar2[1] = 0;
            *(undefined1 *)(plVar2 + 2) = 0;
            std::__cxx11::string::_M_append((char *)&local_f0,local_140._0_8_);
            if ((pointer)local_140._0_8_ != (pointer)(local_140 + 0x10)) {
              operator_delete((void *)local_140._0_8_,
                              (ulong)((long)&(((string *)local_140._16_8_)->_M_dataplus)._M_p + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
              operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1
                             );
            }
          }
        }
      }
      if (local_e8 != 0) {
        this = cmMakefile::GetCMakeInstance(local_d0);
        local_68[0] = local_58;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"Used compile ","");
        plVar2 = (long *)std::__cxx11::string::append((char *)local_68);
        local_160 = &local_150;
        puVar5 = (ulong *)(plVar2 + 2);
        if ((ulong *)*plVar2 == puVar5) {
          local_150 = *puVar5;
          uStack_148 = (undefined4)plVar2[3];
          uStack_144 = *(undefined4 *)((long)plVar2 + 0x1c);
        }
        else {
          local_150 = *puVar5;
          local_160 = (ulong *)*plVar2;
        }
        local_158 = plVar2[1];
        *plVar2 = (long)puVar5;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        local_110._M_p = (pointer)&local_100;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_110," for target ","");
        uVar9 = 0xf;
        if (local_160 != &local_150) {
          uVar9 = local_150;
        }
        if (uVar9 < (ulong)(local_108 + local_158)) {
          uVar10 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_p != &local_100) {
            uVar10 = local_100._M_allocated_capacity;
          }
          if ((ulong)uVar10 < (ulong)(local_108 + local_158)) goto LAB_002b06ec;
          puVar3 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,(ulong)local_160);
        }
        else {
LAB_002b06ec:
          puVar3 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_160,(ulong)local_110._M_p);
        }
        local_188 = &local_178;
        plVar2 = puVar3 + 2;
        if ((long *)*puVar3 == plVar2) {
          local_178 = *plVar2;
          uStack_170 = puVar3[3];
        }
        else {
          local_178 = *plVar2;
          local_188 = (long *)*puVar3;
        }
        local_180 = puVar3[1];
        *puVar3 = plVar2;
        puVar3[1] = 0;
        *(undefined1 *)plVar2 = 0;
        plVar2 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_188,(ulong)(local_168->Name)._M_dataplus._M_p);
        local_c8 = &local_b8;
        plVar6 = plVar2 + 2;
        if ((long *)*plVar2 == plVar6) {
          local_b8 = *plVar6;
          lStack_b0 = plVar2[3];
        }
        else {
          local_b8 = *plVar6;
          local_c8 = (long *)*plVar2;
        }
        local_c0 = plVar2[1];
        *plVar2 = (long)plVar6;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::append((char *)&local_c8);
        local_a8 = &local_98;
        plVar6 = plVar2 + 2;
        if ((long *)*plVar2 == plVar6) {
          local_98 = *plVar6;
          lStack_90 = plVar2[3];
        }
        else {
          local_98 = *plVar6;
          local_a8 = (long *)*plVar2;
        }
        local_a0 = plVar2[1];
        *plVar2 = (long)plVar6;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_a8,(ulong)local_f0);
        local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
        psVar7 = (size_type *)(plVar2 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar2 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar7) {
          local_1a8.field_2._M_allocated_capacity = *psVar7;
          local_1a8.field_2._8_8_ = plVar2[3];
        }
        else {
          local_1a8.field_2._M_allocated_capacity = *psVar7;
          local_1a8._M_dataplus._M_p = (pointer)*plVar2;
        }
        local_1a8._M_string_length = plVar2[1];
        *plVar2 = (long)psVar7;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        __x = ((*ppTVar8)->ge).x_;
        std::vector<cmListFileContext,_std::allocator<cmListFileContext>_>::vector
                  ((vector<cmListFileContext,_std::allocator<cmListFileContext>_> *)local_140,
                   (vector<cmListFileContext,_std::allocator<cmListFileContext>_> *)__x);
        local_118 = (__x->Backtrace).Snapshot.Position.Position;
        pcStack_128 = (__x->Backtrace).Snapshot.State;
        pcStack_120 = (__x->Backtrace).Snapshot.Position.Tree;
        cmake::IssueMessage(this,LOG,&local_1a8,(cmListFileBacktrace *)local_140);
        std::vector<cmListFileContext,_std::allocator<cmListFileContext>_>::~vector
                  ((vector<cmListFileContext,_std::allocator<cmListFileContext>_> *)local_140);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
          operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
        }
        if (local_a8 != &local_98) {
          operator_delete(local_a8,local_98 + 1);
        }
        if (local_c8 != &local_b8) {
          operator_delete(local_c8,local_b8 + 1);
        }
        if (local_188 != &local_178) {
          operator_delete(local_188,local_178 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_p != &local_100) {
          operator_delete(local_110._M_p,local_100._M_allocated_capacity + 1);
        }
        if (local_160 != &local_150) {
          operator_delete(local_160,local_150 + 1);
        }
        if (local_68[0] != local_58) {
          operator_delete(local_68[0],local_58[0] + 1);
        }
      }
      if (local_f0 != &local_e0) {
        operator_delete(local_f0,CONCAT71(uStack_df,local_e0) + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_88);
      ppTVar8 = ppTVar8 + 1;
    } while (ppTVar8 != local_48);
  }
  return;
}

Assistant:

static void processCompileOptionsInternal(cmTarget const* tgt,
      const std::vector<cmTargetInternals::TargetPropertyEntry*> &entries,
      std::vector<std::string> &options,
      UNORDERED_SET<std::string> &uniqueOptions,
      cmGeneratorExpressionDAGChecker *dagChecker,
      const std::string& config, bool debugOptions, const char *logName,
      std::string const& language)
{
  cmMakefile *mf = tgt->GetMakefile();

  for (std::vector<cmTargetInternals::TargetPropertyEntry*>::const_iterator
      it = entries.begin(), end = entries.end(); it != end; ++it)
    {
    std::vector<std::string> entryOptions;
    cmSystemTools::ExpandListArgument((*it)->ge->Evaluate(mf,
                                              config,
                                              false,
                                              tgt,
                                              dagChecker,
                                              language),
                                    entryOptions);
    std::string usedOptions;
    for(std::vector<std::string>::iterator
          li = entryOptions.begin(); li != entryOptions.end(); ++li)
      {
      std::string const& opt = *li;

      if(uniqueOptions.insert(opt).second)
        {
        options.push_back(opt);
        if (debugOptions)
          {
          usedOptions += " * " + opt + "\n";
          }
        }
      }
    if (!usedOptions.empty())
      {
      mf->GetCMakeInstance()->IssueMessage(cmake::LOG,
                            std::string("Used compile ") + logName
                            + std::string(" for target ")
                            + tgt->GetName() + ":\n"
                            + usedOptions, (*it)->ge->GetBacktrace());
      }
    }
}